

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

bool __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::IsInsufficient
          (MP<135UL,_GF2::MOLex<135UL>_> *this,WW<135UL> *vars)

{
  bool bVar1;
  WW<135UL> *pWVar2;
  _List_node_base *p_Var3;
  WW<135UL> mask;
  WW<135UL> local_40;
  
  WW<135UL>::SetAllZero(&local_40);
  p_Var3 = (_List_node_base *)this;
  do {
    p_Var3 = (((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)&p_Var3->_M_next)->
             super__List_base<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)this) break;
    pWVar2 = WW<135UL>::operator=(&local_40,vars);
    pWVar2 = WW<135UL>::operator&=(pWVar2,(WW<135UL> *)(p_Var3 + 1));
    bVar1 = WW<135UL>::IsAllZero(pWVar2);
  } while (bVar1);
  return p_Var3 == (_List_node_base *)this;
}

Assistant:

bool IsInsufficient(const WW<_n>& vars) const
	{
		WW<_n> mask;
		for (const_iterator iter = begin(); iter != end(); ++iter)
			if (!((mask = vars) &= *iter).IsAllZero())
				return false;
		return true;
	}